

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O3

void __thiscall t_markdown_generator::print_doc(t_markdown_generator *this,t_doc *tdoc)

{
  string local_30;
  
  if (tdoc->has_doc_ == true) {
    if (this->unsafe_ == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->f_out_,(tdoc->doc_)._M_dataplus._M_p,
                 (tdoc->doc_)._M_string_length);
      return;
    }
    escape_html(&local_30,this,&tdoc->doc_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->f_out_,local_30._M_dataplus._M_p,local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void t_markdown_generator::print_doc(t_doc* tdoc) {
  if (tdoc->has_doc()) {
    if (unsafe_) {
      f_out_ << tdoc->get_doc();
    } else {
      f_out_ << escape_html(tdoc->get_doc());
    }
  }
}